

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::TriangleLight>::lerp
          (LightNodeImpl<embree::SceneGraph::TriangleLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  long *plVar33;
  _func_int **pp_Var34;
  long *in_RDX;
  float fVar35;
  
  if (*in_RDX == 0) {
    plVar33 = (long *)0x0;
  }
  else {
    plVar33 = (long *)__dynamic_cast(*in_RDX,&LightNode::typeinfo,&typeinfo);
  }
  if (plVar33 != (long *)0x0) {
    (**(code **)(*plVar33 + 0x10))(plVar33);
  }
  pp_Var34 = (_func_int **)alignedMalloc(0xc0,0x10);
  fVar35 = 1.0 - f;
  fVar1 = *(float *)(plVar33 + 0x10);
  fVar2 = *(float *)((long)plVar33 + 0x84);
  fVar3 = *(float *)(plVar33 + 0x11);
  fVar4 = *(float *)((long)plVar33 + 0x8c);
  fVar5 = *(float *)&light1_in[0x10].ptr;
  fVar6 = *(float *)((long)&light1_in[0x10].ptr + 4);
  fVar7 = *(float *)&light1_in[0x11].ptr;
  fVar8 = *(float *)((long)&light1_in[0x11].ptr + 4);
  fVar9 = *(float *)(plVar33 + 0x12);
  fVar10 = *(float *)((long)plVar33 + 0x94);
  fVar11 = *(float *)(plVar33 + 0x13);
  fVar12 = *(float *)((long)plVar33 + 0x9c);
  fVar13 = *(float *)&light1_in[0x12].ptr;
  fVar14 = *(float *)((long)&light1_in[0x12].ptr + 4);
  fVar15 = *(float *)&light1_in[0x13].ptr;
  fVar16 = *(float *)((long)&light1_in[0x13].ptr + 4);
  fVar17 = *(float *)(plVar33 + 0x14);
  fVar18 = *(float *)((long)plVar33 + 0xa4);
  fVar19 = *(float *)(plVar33 + 0x15);
  fVar20 = *(float *)((long)plVar33 + 0xac);
  fVar21 = *(float *)&light1_in[0x14].ptr;
  fVar22 = *(float *)((long)&light1_in[0x14].ptr + 4);
  fVar23 = *(float *)&light1_in[0x15].ptr;
  fVar24 = *(float *)((long)&light1_in[0x15].ptr + 4);
  fVar25 = *(float *)(plVar33 + 0x16);
  fVar26 = *(float *)((long)plVar33 + 0xb4);
  fVar27 = *(float *)(plVar33 + 0x17);
  fVar28 = *(float *)((long)plVar33 + 0xbc);
  fVar29 = *(float *)&light1_in[0x16].ptr;
  fVar30 = *(float *)((long)&light1_in[0x16].ptr + 4);
  fVar31 = *(float *)&light1_in[0x17].ptr;
  fVar32 = *(float *)((long)&light1_in[0x17].ptr + 4);
  pp_Var34[1] = (_func_int *)0x0;
  pp_Var34[2] = (_func_int *)(pp_Var34 + 4);
  pp_Var34[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var34 + 4) = 0;
  pp_Var34[6] = (_func_int *)(pp_Var34 + 8);
  pp_Var34[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var34 + 8) = 0;
  pp_Var34[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var34 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var34 + 0x5c) = 0xffffffff;
  pp_Var34[0xc] = (_func_int *)0x0;
  *pp_Var34 = (_func_int *)&PTR__Node_002ccf98;
  *(undefined4 *)(pp_Var34 + 0xe) = 5;
  *(float *)(pp_Var34 + 0x10) = fVar5 * fVar35 + fVar1 * f;
  *(float *)((long)pp_Var34 + 0x84) = fVar6 * fVar35 + fVar2 * f;
  *(float *)(pp_Var34 + 0x11) = fVar7 * fVar35 + fVar3 * f;
  *(float *)((long)pp_Var34 + 0x8c) = fVar8 * fVar35 + fVar4 * f;
  *(float *)(pp_Var34 + 0x12) = fVar13 * fVar35 + fVar9 * f;
  *(float *)((long)pp_Var34 + 0x94) = fVar14 * fVar35 + fVar10 * f;
  *(float *)(pp_Var34 + 0x13) = fVar15 * fVar35 + fVar11 * f;
  *(float *)((long)pp_Var34 + 0x9c) = fVar16 * fVar35 + fVar12 * f;
  *(float *)(pp_Var34 + 0x14) = fVar21 * fVar35 + fVar17 * f;
  *(float *)((long)pp_Var34 + 0xa4) = fVar22 * fVar35 + fVar18 * f;
  *(float *)(pp_Var34 + 0x15) = fVar23 * fVar35 + fVar19 * f;
  *(float *)((long)pp_Var34 + 0xac) = fVar24 * fVar35 + fVar20 * f;
  *(float *)(pp_Var34 + 0x16) = fVar35 * fVar29 + f * fVar25;
  *(float *)((long)pp_Var34 + 0xb4) = fVar35 * fVar30 + f * fVar26;
  *(float *)(pp_Var34 + 0x17) = fVar35 * fVar31 + f * fVar27;
  *(float *)((long)pp_Var34 + 0xbc) = fVar35 * fVar32 + f * fVar28;
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var34;
  LOCK();
  pp_Var34[1] = pp_Var34[1] + 1;
  UNLOCK();
  if (plVar33 != (long *)0x0) {
    (**(code **)(*plVar33 + 0x18))(plVar33);
  }
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }